

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O2

void __thiscall
IRBuilderAsmJs::BuildBrCmp
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,int32 relativeOffset,
          RegOpnd *src1Opnd,Opnd *src2Opnd)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  BranchInstr *branchInstr;
  
  uVar3 = Js::ByteCodeReader::GetCurrentOffset(&this->m_jnReader);
  if ((ushort)(newOpcode - Case_Int) < 2) {
    SwitchIRBuilder::OnCase(&this->m_switchBuilder,src1Opnd,src2Opnd,offset,uVar3 + relativeOffset);
    return;
  }
  if (newOpcode != BrEq_Int) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0xbf9,"(newOpcode == Js::OpCodeAsmJs::BrEq_Int)",
                       "newOpcode == Js::OpCodeAsmJs::BrEq_Int");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  branchInstr = IR::BranchInstr::New
                          (BrEq_I4,(LabelInstr *)0x0,&src1Opnd->super_Opnd,src2Opnd,this->m_func);
  AddBranchInstr(this,branchInstr,offset,uVar3 + relativeOffset);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildBrCmp(Js::OpCodeAsmJs newOpcode, uint32 offset, int32 relativeOffset, IR::RegOpnd* src1Opnd, IR::Opnd* src2Opnd)
{
    uint targetOffset = m_jnReader.GetCurrentOffset() + relativeOffset;

    if (newOpcode == Js::OpCodeAsmJs::Case_Int || newOpcode == Js::OpCodeAsmJs::Case_IntConst)
    {
        // branches for cases are generated entirely by the switch builder
        m_switchBuilder.OnCase(
            src1Opnd,
            src2Opnd,
            offset,
            targetOffset);
    }
    else
    {
        Assert(newOpcode == Js::OpCodeAsmJs::BrEq_Int);
        IR::BranchInstr * branchInstr = IR::BranchInstr::New(Js::OpCode::BrEq_I4, nullptr, src1Opnd, src2Opnd, m_func);
        AddBranchInstr(branchInstr, offset, targetOffset);
    }
}